

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::iterate(InputVariablesCannotBeModifiedTest *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  ApiType AVar4;
  GLuint GVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  char *local_6e0;
  string local_658;
  string local_638;
  MessageBuilder local_618;
  char temp [1024];
  GLuint local_84;
  _shader_stage local_80;
  GLuint so_id;
  _shader_stage current_iteration_shader_stage;
  ApiType local_6c;
  undefined8 uStack_68;
  ApiType current_iteration_min_context_type;
  char *current_iteration_body_raw_ptr;
  string current_iteration_body;
  _test_iteration local_38;
  GLint compile_status;
  int current_iteration;
  bool result;
  Functions *gl;
  ContextType context_type;
  InputVariablesCannotBeModifiedTest *this_local;
  long lVar8;
  
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  bVar1 = true;
  AVar4 = glu::ApiType::core(3,2);
  bVar2 = glu::contextSupports(ctxType,AVar4);
  if (bVar2) {
    GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar5;
  }
  AVar4 = glu::ApiType::core(4,0);
  bVar2 = glu::contextSupports(ctxType,AVar4);
  if (bVar2) {
    GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8e88);
    this->m_tc_id = GVar5;
    GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8e87);
    this->m_te_id = GVar5;
  }
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x380);
  for (local_38 = TEST_ITERATION_FIRST; (int)local_38 < 0x14;
      local_38 = local_38 + TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK) {
    current_iteration_body.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)&current_iteration_body_raw_ptr);
    uStack_68 = 0;
    glu::ApiType::ApiType(&local_6c);
    getIterationData(this,local_38,&local_6c,&local_80,(string *)&current_iteration_body_raw_ptr);
    uStack_68 = std::__cxx11::string::c_str();
    bVar2 = glu::contextSupports(ctxType,local_6c);
    if (bVar2) {
      switch(local_80) {
      case SHADER_STAGE_FRAGMENT:
        local_84 = this->m_fs_id;
        break;
      case SHADER_STAGE_GEOMETRY:
        local_84 = this->m_gs_id;
        break;
      case SHADER_STAGE_TESSELLATION_CONTROL:
        local_84 = this->m_tc_id;
        break;
      case SHADER_STAGE_TESSELLATION_EVALUATION:
        local_84 = this->m_te_id;
        break;
      case SHADER_STAGE_VERTEX:
        local_84 = this->m_vs_id;
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader stage type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                   ,0x3ad);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar8 + 0x12b8))(local_84,1,&stack0xffffffffffffff98,0);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3b6);
      (**(code **)(lVar8 + 0x248))(local_84);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3ba);
      (**(code **)(lVar8 + 0xa70))
                (local_84,0x8b81,(undefined1 *)((long)&current_iteration_body.field_2 + 0xc));
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3bd);
      (**(code **)(lVar8 + 0xa58))(local_84,0x400,0);
      if (current_iteration_body.field_2._12_4_ == 1) {
        this_01 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_618,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_618,(char (*) [15])"The following ");
        getShaderStageName_abi_cxx11_(&local_638,this,local_80);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_638);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [35])0x2a7290b);
        getIterationName_abi_cxx11_(&local_658,this,local_38);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_658);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [66])
                                   "] was compiled successfully, even though it is invalid. Body:\n>>\n"
                           );
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&current_iteration_body_raw_ptr);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])"\n<<\n");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_638);
        tcu::MessageBuilder::~MessageBuilder(&local_618);
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)&current_iteration_body_raw_ptr);
  }
  if (bVar1) {
    local_6e0 = "Pass";
  }
  else {
    local_6e0 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,local_6e0);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InputVariablesCannotBeModifiedTest::iterate()
{
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= true;

	/* Create shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); current_iteration++)
	{
		glw::GLint	compile_status = GL_FALSE;
		std::string   current_iteration_body;
		const char*   current_iteration_body_raw_ptr = NULL;
		glu::ApiType  current_iteration_min_context_type;
		_shader_stage current_iteration_shader_stage;
		glw::GLuint   so_id = 0;

		getIterationData(static_cast<_test_iteration>(current_iteration), &current_iteration_min_context_type,
						 &current_iteration_shader_stage, &current_iteration_body);

		current_iteration_body_raw_ptr = current_iteration_body.c_str();

		/* Determine shader ID for the iteration. If the shader stage is not supported
		 * for the running context, skip it. */
		if (!glu::contextSupports(context_type, current_iteration_min_context_type))
		{
			continue;
		}

		switch (current_iteration_shader_stage)
		{
		case SHADER_STAGE_FRAGMENT:
			so_id = m_fs_id;
			break;
		case SHADER_STAGE_GEOMETRY:
			so_id = m_gs_id;
			break;
		case SHADER_STAGE_TESSELLATION_CONTROL:
			so_id = m_tc_id;
			break;
		case SHADER_STAGE_TESSELLATION_EVALUATION:
			so_id = m_te_id;
			break;
		case SHADER_STAGE_VERTEX:
			so_id = m_vs_id;
			break;

		default:
		{
			TCU_FAIL("Unrecognized shader stage type");
		}
		} /* switch (current_iteration_shader_stage) */

		DE_ASSERT(so_id != 0);

		/* Assign the source code to the SO */
		gl.shaderSource(so_id, 1,								   /* count */
						&current_iteration_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		char temp[1024];

		gl.getShaderInfoLog(so_id, 1024, NULL, temp);

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following "
							   << getShaderStageName(current_iteration_shader_stage)
							   << " shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << current_iteration_body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}